

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseOffsetOfExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  OffsetOfExpressionSyntax *pOVar3;
  IndexType IVar4;
  ostream *poVar5;
  string local_40;
  
  pSVar2 = peek(this,1);
  if ((pSVar2->syntaxK_ == Keyword_ExtGNU___builtin_offsetof) ||
     (pSVar2 = peek(this,1), pSVar2->syntaxK_ == Keyword_MacroStd_offsetof)) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_01);
    if (!bVar1) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"GNU internal builtins","");
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    pOVar3 = makeNode<psy::C::OffsetOfExpressionSyntax>(this);
    *expr = &pOVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pOVar3->kwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pOVar3->openParenTkIdx_);
    if ((((bVar1) && (bVar1 = parseTypeName(this,&pOVar3->typeName_), bVar1)) &&
        (bVar1 = match(this,CommaToken,&pOVar3->commaTkIdx_), bVar1)) &&
       (bVar1 = parseOffsetOfDesignator(this,&pOVar3->offsetOfDesignator_), bVar1)) {
      bVar1 = match(this,CloseParenToken,&pOVar3->closeParenTkIdx_);
      return bVar1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"assert failure: `__builtin_offsetof\'",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseOffsetOfExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_offsetof
                  || peek().kind() == SyntaxKind::Keyword_MacroStd_offsetof,
                  return false,
                  "assert failure: `__builtin_offsetof'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto offsetOfExpr = makeNode<OffsetOfExpressionSyntax>();
    expr = offsetOfExpr;
    offsetOfExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &offsetOfExpr->openParenTkIdx_)
        && parseTypeName(offsetOfExpr->typeName_)
        && match(SyntaxKind::CommaToken, &offsetOfExpr->commaTkIdx_)
        && parseOffsetOfDesignator(offsetOfExpr->offsetOfDesignator_)
        && match(SyntaxKind::CloseParenToken, &offsetOfExpr->closeParenTkIdx_);
}